

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

DecoderBuffer * __thiscall
randomx::DecoderBuffer::fetchNext
          (DecoderBuffer *this,SuperscalarInstructionType instrType,int cycle,int mulCount,
          Blake2Generator *gen)

{
  byte bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Blake2Generator *in_RDI;
  Blake2Generator *in_stack_ffffffffffffffc8;
  DecoderBuffer *local_8;
  
  if ((in_ESI == 0xb) || (in_ESI == 0xc)) {
    local_8 = (DecoderBuffer *)decodeBuffer3310;
  }
  else if (in_ECX < in_EDX + 1) {
    local_8 = (DecoderBuffer *)decodeBuffer4444;
  }
  else if (in_ESI == 0xd) {
    bVar1 = Blake2Generator::getByte(in_RDI);
    local_8 = (DecoderBuffer *)decodeBuffer493;
    if ((bVar1 & 1) != 0) {
      local_8 = (DecoderBuffer *)decodeBuffer484;
    }
  }
  else {
    local_8 = fetchNextDefault((DecoderBuffer *)in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

const DecoderBuffer* fetchNext(SuperscalarInstructionType instrType, int cycle, int mulCount, Blake2Generator& gen) const {
			//If the current RandomX instruction is "IMULH", the next fetch configuration must be 3-3-10
			//because the full 128-bit multiplication instruction is 3 bytes long and decodes to 2 uOPs on Intel CPUs.
			//Intel CPUs can decode at most 4 uOPs per cycle, so this requires a 2-1-1 configuration for a total of 3 macro ops.
			if (instrType == SuperscalarInstructionType::IMULH_R || instrType == SuperscalarInstructionType::ISMULH_R)
				return &decodeBuffer3310;

			//To make sure that the multiplication port is saturated, a 4-4-4-4 configuration is generated if the number of multiplications
			//is lower than the number of cycles.
			if (mulCount < cycle + 1)
				return &decodeBuffer4444;

			//If the current RandomX instruction is "IMUL_RCP", the next buffer must begin with a 4-byte slot for multiplication.
			if(instrType == SuperscalarInstructionType::IMUL_RCP)
				return (gen.getByte() & 1) ? &decodeBuffer484 : &decodeBuffer493;

			//Default: select a random fetch configuration.
			return fetchNextDefault(gen);
		}